

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_STATE * sinc_state_new(int converter_type,int channels,SRC_ERROR *error)

{
  int iVar1;
  int iVar2;
  SRC_STATE *__ptr;
  SRC_STATE_VT *pSVar3;
  undefined4 *__ptr_00;
  ulong uVar4;
  void *pvVar5;
  SINC_FILTER *filter;
  SRC_ERROR SVar6;
  
  if (2 < (uint)converter_type) {
    __assert_fail("converter_type == SRC_SINC_FASTEST || converter_type == SRC_SINC_MEDIUM_QUALITY || converter_type == SRC_SINC_BEST_QUALITY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x109,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10a,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (error == (SRC_ERROR *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x10b,"SRC_STATE *sinc_state_new(int, int, SRC_ERROR *)");
  }
  if (channels < 0x81) {
    __ptr = (SRC_STATE *)calloc(1,0x50);
    SVar6 = SRC_ERR_MALLOC_FAILED;
    if (__ptr != (SRC_STATE *)0x0) {
      __ptr->channels = channels;
      __ptr->mode = SRC_MODE_PROCESS;
      if ((uint)channels < 7) {
        pSVar3 = (SRC_STATE_VT *)(&__do_global_dtors_aux_fini_array_entry)[channels];
      }
      else {
        pSVar3 = &sinc_multichan_state_vt;
      }
      __ptr->vt = pSVar3;
      if (0x80 < (uint)channels) {
        __assert_fail("channels > 0 && channels <= MAX_CHANNELS",
                      "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                      ,0xd4,"SINC_FILTER *sinc_filter_new(int, int)");
      }
      __ptr_00 = (undefined4 *)calloc(1,0x860);
      if (__ptr_00 == (undefined4 *)0x0) {
LAB_00102a3a:
        __ptr_00 = (undefined4 *)0x0;
      }
      else {
        *__ptr_00 = 0x26a5050;
        uVar4 = (ulong)(uint)converter_type;
        iVar2 = *(int *)(&DAT_0026b854 + uVar4 * 4);
        iVar1 = *(int *)(&DAT_0026b860 + uVar4 * 4);
        *(undefined **)(__ptr_00 + 0x10) = &DAT_0026b848 + *(int *)(&DAT_0026b848 + uVar4 * 4);
        __ptr_00[10] = iVar2;
        __ptr_00[0xb] = iVar1;
        iVar1 = (int)ROUND((((double)iVar2 + 2.0) / (double)iVar1) * 256.0 + 1.0);
        iVar2 = 0x1000;
        if (0x555 < iVar1) {
          iVar2 = iVar1 * 3;
        }
        __ptr_00[0x15] = iVar2 * channels + 1;
        pvVar5 = calloc((ulong)(iVar2 * channels + channels + 1),4);
        *(void **)(__ptr_00 + 0x216) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr_00);
          goto LAB_00102a3a;
        }
      }
      __ptr->private_data = __ptr_00;
      if (__ptr_00 != (undefined4 *)0x0) {
        *(undefined8 *)(__ptr_00 + 0x12) = 0;
        __ptr_00[0x14] = 0xffffffff;
        *(undefined8 *)(__ptr_00 + 0xc) = 0;
        *(undefined8 *)(__ptr_00 + 0xe) = 0;
        SVar6 = SRC_ERR_NO_ERROR;
        memset(*(void **)(__ptr_00 + 0x216),0,(long)(int)__ptr_00[0x15] << 2);
        memset((void *)((long)(int)__ptr_00[0x15] * 4 + *(long *)(__ptr_00 + 0x216)),0xaa,
               (ulong)(uint)(channels << 2));
        goto LAB_00102aad;
      }
      free(__ptr);
    }
  }
  else {
    SVar6 = SRC_ERR_BAD_CHANNEL_COUNT;
  }
  __ptr = (SRC_STATE *)0x0;
LAB_00102aad:
  *error = SVar6;
  return __ptr;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
sinc_state_new (int converter_type, int channels, SRC_ERROR *error)
{
	assert (converter_type == SRC_SINC_FASTEST ||
		converter_type == SRC_SINC_MEDIUM_QUALITY ||
		converter_type == SRC_SINC_BEST_QUALITY) ;
	assert (channels > 0) ;
	assert (error != NULL) ;

	if (channels > MAX_CHANNELS)
	{
		*error = SRC_ERR_BAD_CHANNEL_COUNT ;
		return NULL ;
	}

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	if (state->channels == 1)
		state->vt = &sinc_mono_state_vt ;
	else if (state->channels == 2)
		state->vt = &sinc_stereo_state_vt ;
	else if (state->channels == 4)
		state->vt = &sinc_quad_state_vt ;
	else if (state->channels == 6)
		state->vt = &sinc_hex_state_vt ;
	else
		state->vt = &sinc_multichan_state_vt ;

	state->private_data = sinc_filter_new (converter_type, state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	sinc_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}